

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrPassthroughMeshTransformInfoHTC *value)

{
  NextChainResult NVar1;
  ValidateXrHandleResult VVar2;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  XrResult XVar3;
  XrSpace_T *in_stack_fffffffffffffcf8;
  allocator local_2f9;
  string *local_2f8;
  string local_2f0;
  allocator local_2c9;
  string local_2c8;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_270;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_258;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_240;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  string error_message;
  
  XVar3 = XR_SUCCESS;
  local_2f8 = command_name;
  if (value->type != XR_TYPE_PASSTHROUGH_MESH_TRANSFORM_INFO_HTC) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrPassthroughMeshTransformInfoHTC",
               value->type,"VUID-XrPassthroughMeshTransformInfoHTC-type-type",
               XR_TYPE_PASSTHROUGH_MESH_TRANSFORM_INFO_HTC,
               "XR_TYPE_PASSTHROUGH_MESH_TRANSFORM_INFO_HTC");
  }
  if (!check_pnext) goto LAB_001a121d;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar1 = ValidateNextChain(instance_info,local_2f8,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar1 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_2f0);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_2f0,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::string
              ((string *)&local_2f0,"VUID-XrPassthroughMeshTransformInfoHTC-next-unique",&local_2f9)
    ;
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1f8,objects_info);
    std::__cxx11::string::string
              ((string *)&local_2c8,
               "Multiple structures of the same type(s) in \"next\" chain for XrPassthroughMeshTransformInfoHTC struct"
               ,&local_2c9);
    CoreValidLogMessage(instance_info,&local_2f0,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1f8,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1f8);
    std::__cxx11::string::~string((string *)&local_2f0);
LAB_001a11e8:
    std::__cxx11::string::~string((string *)&error_message);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar1 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrPassthroughMeshTransformInfoHTC-next-next",
               (allocator *)&local_2c8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1e0,objects_info);
    std::__cxx11::string::string
              ((string *)&local_2f0,
               "Invalid structure(s) in \"next\" chain for XrPassthroughMeshTransformInfoHTC struct \"next\""
               ,&local_2f9);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1e0,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1e0);
    goto LAB_001a11e8;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_001a121d:
  if (check_members && XVar3 == XR_SUCCESS) {
    XVar3 = XR_SUCCESS;
    if ((value->vertexCount == 0) && (value->vertices != (XrVector3f *)0x0)) {
      std::__cxx11::string::string
                ((string *)&error_message,
                 "VUID-XrPassthroughMeshTransformInfoHTC-vertexCount-arraylength",
                 (allocator *)&local_2c8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_210,objects_info);
      std::__cxx11::string::string
                ((string *)&local_2f0,
                 "Structure XrPassthroughMeshTransformInfoHTC member vertexCount is non-optional and must be greater than 0"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_210,&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_210);
      std::__cxx11::string::~string((string *)&error_message);
      XVar3 = XR_ERROR_VALIDATION_FAILURE;
    }
    if ((value->vertices == (XrVector3f *)0x0) && (value->vertexCount != 0)) {
      std::__cxx11::string::string
                ((string *)&error_message,
                 "VUID-XrPassthroughMeshTransformInfoHTC-vertices-parameter",(allocator *)&local_2c8
                );
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_228,objects_info);
      std::__cxx11::string::string
                ((string *)&local_2f0,
                 "XrPassthroughMeshTransformInfoHTC contains invalid NULL for XrVector3f \"vertices\" is which not optional since \"vertexCount\" is set and must be non-NULL"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_228,&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      this = &local_228;
    }
    else {
      if ((value->indexCount == 0) && (value->indices != (uint32_t *)0x0)) {
        std::__cxx11::string::string
                  ((string *)&error_message,
                   "VUID-XrPassthroughMeshTransformInfoHTC-indexCount-arraylength",
                   (allocator *)&local_2c8);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_240,objects_info);
        std::__cxx11::string::string
                  ((string *)&local_2f0,
                   "Structure XrPassthroughMeshTransformInfoHTC member indexCount is non-optional and must be greater than 0"
                   ,(allocator *)&valid_ext_structs);
        CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_240,&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_240);
        std::__cxx11::string::~string((string *)&error_message);
        XVar3 = XR_ERROR_VALIDATION_FAILURE;
      }
      if ((value->indices != (uint32_t *)0x0) || (value->indexCount == 0)) {
        VVar2 = VerifyXrSpaceHandle(&value->baseSpace);
        if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
          return XVar3;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,"Invalid XrSpace handle \"baseSpace\" ");
        HandleToHexString<XrSpace_T*>(in_stack_fffffffffffffcf8);
        std::operator<<((ostream *)&error_message,(string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::string
                  ((string *)&local_2f0,"VUID-XrPassthroughMeshTransformInfoHTC-baseSpace-parameter"
                   ,(allocator *)&valid_ext_structs);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_270,objects_info);
        std::__cxx11::stringbuf::str();
        CoreValidLogMessage(instance_info,&local_2f0,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_270,&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_270);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
        return XR_ERROR_HANDLE_INVALID;
      }
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrPassthroughMeshTransformInfoHTC-indices-parameter"
                 ,(allocator *)&local_2c8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_258,objects_info);
      std::__cxx11::string::string
                ((string *)&local_2f0,
                 "XrPassthroughMeshTransformInfoHTC contains invalid NULL for uint32_t \"indices\" is which not optional since \"indexCount\" is set and must be non-NULL"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2f8,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_258,&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      this = &local_258;
    }
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
    std::__cxx11::string::~string((string *)&error_message);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  return XVar3;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrPassthroughMeshTransformInfoHTC* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_PASSTHROUGH_MESH_TRANSFORM_INFO_HTC) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrPassthroughMeshTransformInfoHTC",
                             value->type, "VUID-XrPassthroughMeshTransformInfoHTC-type-type", XR_TYPE_PASSTHROUGH_MESH_TRANSFORM_INFO_HTC, "XR_TYPE_PASSTHROUGH_MESH_TRANSFORM_INFO_HTC");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrPassthroughMeshTransformInfoHTC-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrPassthroughMeshTransformInfoHTC struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrPassthroughMeshTransformInfoHTC : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrPassthroughMeshTransformInfoHTC-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrPassthroughMeshTransformInfoHTC struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->vertexCount && nullptr != value->vertices) {
        CoreValidLogMessage(instance_info, "VUID-XrPassthroughMeshTransformInfoHTC-vertexCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrPassthroughMeshTransformInfoHTC member vertexCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->vertices && 0 != value->vertexCount) {
        CoreValidLogMessage(instance_info, "VUID-XrPassthroughMeshTransformInfoHTC-vertices-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrPassthroughMeshTransformInfoHTC contains invalid NULL for XrVector3f \"vertices\" is which not "
                            "optional since \"vertexCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrPassthroughMeshTransformInfoHTC-vertices-parameter" type
    // Non-optional array length must be non-zero
    if (0 >= value->indexCount && nullptr != value->indices) {
        CoreValidLogMessage(instance_info, "VUID-XrPassthroughMeshTransformInfoHTC-indexCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrPassthroughMeshTransformInfoHTC member indexCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->indices && 0 != value->indexCount) {
        CoreValidLogMessage(instance_info, "VUID-XrPassthroughMeshTransformInfoHTC-indices-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrPassthroughMeshTransformInfoHTC contains invalid NULL for uint32_t \"indices\" is which not "
                            "optional since \"indexCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrPassthroughMeshTransformInfoHTC-indices-parameter" type
    {
        // writeValidateInlineHandleValidation
        ValidateXrHandleResult handle_result = VerifyXrSpaceHandle(&value->baseSpace);
        if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
            // Not a valid handle or NULL (which is not valid in this case)
            std::ostringstream oss;
            oss << "Invalid XrSpace handle \"baseSpace\" ";
            oss << HandleToHexString(value->baseSpace);
            CoreValidLogMessage(instance_info, "VUID-XrPassthroughMeshTransformInfoHTC-baseSpace-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, oss.str());
            return XR_ERROR_HANDLE_INVALID;
        }
    }
    // Everything checked out properly
    return xr_result;
}